

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O1

void __thiscall
PossibleContentsTest_TestOracleMinimal_Test::~PossibleContentsTest_TestOracleMinimal_Test
          (PossibleContentsTest_TestOracleMinimal_Test *this)

{
  PossibleContentsTest::~PossibleContentsTest(&this->super_PossibleContentsTest);
  operator_delete(this,0x3b0);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestOracleMinimal) {
  // A minimal test of the public API of PossibleTypesOracle. See the lit test
  // for coverage of all the internals (using lit makes the result more
  // fuzzable).
  auto wasm = parse(R"(
    (module
      (global $null (ref null any) (ref.null any))
      (global $something i32 (i32.const 42))
    )
  )");
  ContentOracle oracle(*wasm, options);

  // This will be a null constant.
  EXPECT_TRUE(oracle.getContents(GlobalLocation{"null"}).isNull());

  // This will be 42.
  EXPECT_EQ(oracle.getContents(GlobalLocation{"something"}).getLiteral(),
            Literal(int32_t(42)));
}